

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tmpdir.c
# Opt level: O2

int run_test_tmpdir(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  size_t len;
  char tmpdir [4096];
  
  len = 0x1000;
  tmpdir[0] = '\0';
  eval_a = strlen(tmpdir);
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_os_tmpdir(tmpdir,&len);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = strlen(tmpdir);
      eval_b = len;
      if (eval_a == len) {
        eval_a = len;
        eval_b = 0;
        if ((long)len < 1) {
          pcVar3 = ">";
          pcVar4 = "0";
          pcVar2 = "len";
          uVar5 = 0x2b;
        }
        else {
          eval_a = (int64_t)tmpdir[len];
          eval_b = 0;
          if (eval_a == 0) {
            if (1 < len) {
              eval_b = 0x2f;
              if (tmpdir[len - 1] == '/') {
                pcVar3 = "!=";
                pcVar4 = "\'/\'";
                pcVar2 = "last";
                uVar5 = 0x33;
                eval_a = 0x2f;
                goto LAB_0019e65f;
              }
            }
            len = 1;
            iVar1 = uv_os_tmpdir(tmpdir);
            eval_a = (int64_t)iVar1;
            eval_b = -0x69;
            if (eval_a == -0x69) {
              eval_a = len;
              eval_b = 1;
              if ((long)len < 2) {
                pcVar3 = ">";
                pcVar4 = "1";
                pcVar2 = "len";
                uVar5 = 0x3b;
              }
              else {
                iVar1 = uv_os_tmpdir(0,&len);
                eval_a = (int64_t)iVar1;
                eval_b = -0x16;
                if (eval_a == -0x16) {
                  iVar1 = uv_os_tmpdir(tmpdir,0);
                  eval_a = (int64_t)iVar1;
                  eval_b = -0x16;
                  if (eval_a == -0x16) {
                    len = 0;
                    iVar1 = uv_os_tmpdir(tmpdir);
                    eval_a = (int64_t)iVar1;
                    eval_b = -0x16;
                    if (eval_a == -0x16) {
                      return 0;
                    }
                    pcVar3 = "==";
                    pcVar4 = "UV_EINVAL";
                    pcVar2 = "r";
                    uVar5 = 0x44;
                  }
                  else {
                    pcVar3 = "==";
                    pcVar4 = "UV_EINVAL";
                    pcVar2 = "r";
                    uVar5 = 0x41;
                  }
                }
                else {
                  pcVar3 = "==";
                  pcVar4 = "UV_EINVAL";
                  pcVar2 = "r";
                  uVar5 = 0x3f;
                }
              }
            }
            else {
              pcVar3 = "==";
              pcVar4 = "UV_ENOBUFS";
              pcVar2 = "r";
              uVar5 = 0x3a;
            }
          }
          else {
            pcVar3 = "==";
            pcVar4 = "\'\\0\'";
            pcVar2 = "tmpdir[len]";
            uVar5 = 0x2c;
          }
        }
      }
      else {
        pcVar3 = "==";
        pcVar4 = "len";
        pcVar2 = "strlen(tmpdir)";
        uVar5 = 0x2a;
      }
    }
    else {
      pcVar3 = "==";
      pcVar4 = "0";
      pcVar2 = "r";
      uVar5 = 0x29;
    }
  }
  else {
    pcVar3 = "==";
    pcVar4 = "0";
    pcVar2 = "strlen(tmpdir)";
    uVar5 = 0x27;
  }
LAB_0019e65f:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tmpdir.c"
          ,uVar5,pcVar2,pcVar3,pcVar4,eval_a,pcVar3,eval_b);
  abort();
}

Assistant:

TEST_IMPL(tmpdir) {
  char tmpdir[PATHMAX];
  size_t len;
  char last;
  int r;

  /* Test the normal case */
  len = sizeof tmpdir;
  tmpdir[0] = '\0';

  ASSERT_OK(strlen(tmpdir));
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT_OK(r);
  ASSERT_EQ(strlen(tmpdir), len);
  ASSERT_GT(len, 0);
  ASSERT_EQ(tmpdir[len], '\0');

  if (len > 1) {
    last = tmpdir[len - 1];
#ifdef _WIN32
    ASSERT_NE(last, '\\');
#else
    ASSERT_NE(last, '/');
#endif
  }

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT_EQ(r, UV_ENOBUFS);
  ASSERT_GT(len, SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_tmpdir(NULL, &len);
  ASSERT_EQ(r, UV_EINVAL);
  r = uv_os_tmpdir(tmpdir, NULL);
  ASSERT_EQ(r, UV_EINVAL);
  len = 0;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT_EQ(r, UV_EINVAL);

#ifdef _WIN32
  const char *name = "TMP";
  char tmpdir_win[] = "C:\\xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx";
  r = uv_os_setenv(name, tmpdir_win);
  ASSERT_OK(r);
  char tmpdirx[PATHMAX];
  size_t lenx = sizeof tmpdirx;
  r = uv_os_tmpdir(tmpdirx, &lenx);
  ASSERT_OK(r);
#endif

  return 0;
}